

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epoll.cc
# Opt level: O1

vector<std::shared_ptr<tt::net::Channel>,_std::allocator<std::shared_ptr<tt::net::Channel>_>_> *
__thiscall
tt::net::Epoll::getEventsRequest
          (vector<std::shared_ptr<tt::net::Channel>,_std::allocator<std::shared_ptr<tt::net::Channel>_>_>
           *__return_storage_ptr__,Epoll *this,int events_num)

{
  int iVar1;
  long lVar2;
  Logger local_1018;
  undefined1 local_40 [8];
  SP_Channel cur_req;
  
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<tt::net::Channel>,_std::allocator<std::shared_ptr<tt::net::Channel>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<tt::net::Channel>,_std::allocator<std::shared_ptr<tt::net::Channel>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<tt::net::Channel>,_std::allocator<std::shared_ptr<tt::net::Channel>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < events_num) {
    lVar2 = 0;
    do {
      iVar1 = *(int *)((long)&((this->m_events).
                               super__Vector_base<epoll_event,_std::allocator<epoll_event>_>._M_impl
                               .super__Vector_impl_data._M_start)->data + lVar2);
      local_40 = (undefined1  [8])
                 this->m_fd2chan[iVar1].
                 super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      cur_req.super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           this->m_fd2chan[iVar1].super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      if (cur_req.super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (cur_req.super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_fd =
               (cur_req.super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               m_fd + 1;
          UNLOCK();
        }
        else {
          (cur_req.super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_fd =
               (cur_req.super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               m_fd + 1;
        }
      }
      if (local_40 == (undefined1  [8])0x0) {
        Logger::Logger(&local_1018,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/HhTtLllL[P]web_server/h_webserver/Epoll.cc"
                       ,0x8e);
        if (0x15 < ((int)&local_1018 + 0xfa8) - (int)local_1018.m_impl.m_stream.m_buffer.m_cur) {
          builtin_strncpy(local_1018.m_impl.m_stream.m_buffer.m_cur,"SP cur_req is invaild",0x15);
          local_1018.m_impl.m_stream.m_buffer.m_cur =
               local_1018.m_impl.m_stream.m_buffer.m_cur + 0x15;
        }
        Logger::~Logger(&local_1018);
      }
      else {
        ((element_type *)local_40)->m_revents =
             *(__uint32_t *)
              ((long)&((this->m_events).
                       super__Vector_base<epoll_event,_std::allocator<epoll_event>_>._M_impl.
                       super__Vector_impl_data._M_start)->events + lVar2);
        ((element_type *)local_40)->m_events = 0;
        std::
        vector<std::shared_ptr<tt::net::Channel>,_std::allocator<std::shared_ptr<tt::net::Channel>_>_>
        ::push_back(__return_storage_ptr__,(value_type *)local_40);
      }
      if (cur_req.super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   cur_req.super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      lVar2 = lVar2 + 0xc;
    } while ((ulong)(uint)events_num * 0xc != lVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<SP_Channel> Epoll::getEventsRequest(int events_num){

	std::vector<SP_Channel> req_data;

	for( int i = 0 ; i < events_num ; ++ i ){

		//获取有事件产生的描述符
		int fd = m_events[i].data.fd;

		SP_Channel cur_req = m_fd2chan[fd];
		
		if(cur_req){
			
			cur_req->setRevents(m_events[i].events);
			cur_req->setEvents(0);

			//加入线程池之前将 Timer 和 request 分离
			
			//cur_req->seperateTimer();

			req_data.push_back(cur_req);
		}else{
			LOG << "SP cur_req is invaild";
		
		}
	}

	return req_data;
}